

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O2

bool __thiscall HEkkDualRow::chooseFinalWorkGroupQuad(HEkkDualRow *this)

{
  HighsInt *__x;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer ppVar7;
  int8_t *piVar8;
  double *pdVar9;
  double *pdVar10;
  HEkk *pHVar11;
  bool bVar12;
  int workCount;
  int iVar13;
  long lVar14;
  pointer ppVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double selectTheta;
  double dVar20;
  double dVar21;
  int local_4c;
  double local_48;
  undefined8 uStack_40;
  
  dVar1 = (this->ekk_instance_->options_->super_HighsOptionsStruct).dual_feasibility_tolerance;
  iVar3 = this->workCount;
  this->workCount = 0;
  local_48 = ABS(this->workDelta);
  uStack_40 = 0;
  piVar6 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar6) {
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar6;
  }
  __x = &this->workCount;
  dVar21 = this->workTheta;
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->workGroup,&local_4c);
  dVar20 = 1e-12;
  dVar18 = 1e+100;
  workCount = this->workCount;
  while (dVar21 < 1e+18) {
    ppVar7 = (this->workData).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar8 = this->workMove;
    pdVar9 = this->workDual;
    pdVar10 = this->workRange;
    lVar14 = (long)workCount;
    ppVar15 = ppVar7 + lVar14;
    selectTheta = 1e+100;
    for (; lVar14 < iVar3; lVar14 = lVar14 + 1) {
      iVar13 = ppVar15->first;
      dVar2 = ppVar15->second;
      dVar19 = (double)(int)piVar8[iVar13] * pdVar9[iVar13];
      if (dVar19 <= dVar21 * dVar2) {
        iVar4 = *__x;
        *__x = iVar4 + 1;
        iVar5 = ppVar7[iVar4].first;
        ppVar7[iVar4].first = ppVar15->first;
        ppVar15->first = iVar5;
        dVar19 = ppVar7[iVar4].second;
        ppVar7[iVar4].second = dVar2;
        ppVar15->second = dVar19;
        dVar20 = dVar20 + dVar2 * pdVar10[iVar13];
      }
      else {
        dVar19 = dVar19 + dVar1;
        if (dVar19 < selectTheta * dVar2) {
          selectTheta = dVar19 / dVar2;
        }
      }
      ppVar15 = ppVar15 + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->workGroup,__x);
    uVar16 = SUB84(selectTheta,0);
    uVar17 = (undefined4)((ulong)selectTheta >> 0x20);
    iVar13 = *__x;
    if ((iVar13 == workCount) && (dVar21 == selectTheta)) {
      if ((dVar18 == selectTheta) && (!NAN(dVar18) && !NAN(selectTheta))) {
        pHVar11 = this->ekk_instance_;
        debugDualChuzcFailQuad0
                  (pHVar11->options_,workCount,&this->workData,
                   (pHVar11->lp_).num_row_ + (pHVar11->lp_).num_col_,this->workDual,selectTheta,
                   selectTheta,true);
        goto LAB_00341e08;
      }
    }
    if ((local_48 <= dVar20) ||
       (dVar18 = selectTheta, dVar21 = selectTheta, workCount = iVar13, iVar13 == iVar3))
    goto LAB_00341d9d;
  }
  uVar16 = SUB84(dVar21,0);
  uVar17 = (undefined4)((ulong)dVar21 >> 0x20);
  iVar13 = workCount;
LAB_00341d9d:
  bVar12 = true;
  if ((int)((ulong)((long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < 2) {
    pHVar11 = this->ekk_instance_;
    debugDualChuzcFailQuad1
              (pHVar11->options_,iVar13,&this->workData,
               (pHVar11->lp_).num_row_ + (pHVar11->lp_).num_col_,this->workDual,
               (double)CONCAT44(uVar17,uVar16),true);
LAB_00341e08:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool HEkkDualRow::chooseFinalWorkGroupQuad() {
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  HighsInt fullCount = workCount;
  workCount = 0;
  double totalChange = kInitialTotalChange;
  double selectTheta = workTheta;
  const double totalDelta = fabs(workDelta);
  workGroup.clear();
  workGroup.push_back(0);
  HighsInt prev_workCount = workCount;
  double prev_remainTheta = kInitialRemainTheta;
  double prev_selectTheta = selectTheta;

  while (selectTheta < kMaxSelectTheta) {
    double remainTheta = kInitialRemainTheta;
    for (HighsInt i = workCount; i < fullCount; i++) {
      HighsInt iCol = workData[i].first;
      double value = workData[i].second;
      double dual = workMove[iCol] * workDual[iCol];
      // Tight satisfy
      if (dual <= selectTheta * value) {
        swap(workData[workCount++], workData[i]);
        totalChange += value * (workRange[iCol]);
      } else if (dual + Td < remainTheta * value) {
        remainTheta = (dual + Td) / value;
      }
    }
    workGroup.push_back(workCount);

    // Update selectTheta with the value of remainTheta;
    selectTheta = remainTheta;
    // Check for no change in this loop - to prevent infinite loop
    if ((workCount == prev_workCount) && (prev_selectTheta == selectTheta) &&
        (prev_remainTheta == remainTheta)) {
      HighsInt num_var =
          ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
      debugDualChuzcFailQuad0(*ekk_instance_.options_, workCount, workData,
                              num_var, workDual, selectTheta, remainTheta,
                              true);
      return false;
    }
    // Record the initial values of workCount, remainTheta and selectTheta for
    // the next pass through the loop - to check for infinite loop condition
    prev_workCount = workCount;
    prev_remainTheta = remainTheta;
    prev_selectTheta = selectTheta;
    if (totalChange >= totalDelta || workCount == fullCount) break;
  }
  // Check that at least one group has been identified
  if ((HighsInt)workGroup.size() <= 1) {
    HighsInt num_var = ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
    debugDualChuzcFailQuad1(*ekk_instance_.options_, workCount, workData,
                            num_var, workDual, selectTheta, true);
    return false;
  }
  return true;
}